

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppManager.cpp
# Opt level: O0

void __thiscall phpconvert::AppManager::run(AppManager *this,AppParams *params)

{
  bool bVar1;
  SystemException *this_00;
  ZendParser *this_01;
  BaseParser *w;
  ZendParser *worker;
  AppParams *params_local;
  AppManager *this_local;
  
  bVar1 = AppParams::isValid(params);
  if (!bVar1) {
    this_00 = (SystemException *)__cxa_allocate_exception(0x10);
    SystemException::SystemException(this_00,INVALID_PARAMETERS);
    __cxa_throw(this_00,&SystemException::typeinfo,SystemException::~SystemException);
  }
  this_01 = (ZendParser *)operator_new(0x90);
  ZendParser::ZendParser(this_01);
  ParserManager::setWorker(this->parser,(BaseParser *)this_01);
  ParserManager::parse(this->parser,params);
  return;
}

Assistant:

void AppManager::run(AppParams *params) {
        if (!params->isValid()) {
            throw SystemException(SystemException::INVALID_PARAMETERS);
        }
        ZendParser *worker = new ZendParser(); //@todo detect plugin
        BaseParser *w = worker;
        parser->setWorker(w);
        parser->parse(params);
    }